

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

int ImFormatStringV(char *buf,int buf_size,char *fmt,__va_list_tag *args)

{
  int iVar1;
  int iVar2;
  
  if (0 < buf_size) {
    iVar1 = vsnprintf(buf,(ulong)(uint)buf_size,fmt,args);
    iVar2 = buf_size + -1;
    if (iVar1 < buf_size) {
      iVar2 = iVar1;
    }
    if (iVar1 == -1) {
      iVar2 = buf_size + -1;
    }
    buf[iVar2] = '\0';
    return iVar2;
  }
  __assert_fail("buf_size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.cpp"
                ,0x3cc,"int ImFormatStringV(char *, int, const char *, __va_list_tag *)");
}

Assistant:

int ImFormatStringV(char* buf, int buf_size, const char* fmt, va_list args)
{
    IM_ASSERT(buf_size > 0);
    int w = vsnprintf(buf, buf_size, fmt, args);
    if (w == -1 || w >= buf_size)
        w = buf_size - 1;
    buf[w] = 0;
    return w;
}